

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O3

void NULLCCanvas::CanvasCommit(Canvas *ptr)

{
  undefined8 uVar1;
  char *pcVar2;
  char *pcVar3;
  float fVar4;
  undefined1 auVar5 [16];
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  
  auVar5 = _DAT_001eb070;
  if (ptr != (Canvas *)0x0) {
    lVar6 = (long)ptr->height * (long)ptr->width;
    if ((int)lVar6 != 0) {
      pcVar2 = (ptr->dataI).ptr;
      pcVar3 = (ptr->data).ptr;
      lVar7 = 0;
      fVar8 = (float)DAT_001eb070;
      fVar9 = DAT_001eb070._4_4_;
      fVar10 = DAT_001eb070._8_4_;
      fVar11 = DAT_001eb070._12_4_;
      do {
        fVar12 = *(float *)(pcVar3 + lVar7 * 4 + 8) * 255.0;
        fVar4 = 255.0;
        if (fVar12 <= 255.0) {
          fVar4 = fVar12;
        }
        uVar1 = *(undefined8 *)(pcVar3 + lVar7 * 4);
        fVar13 = (float)uVar1 * fVar8;
        fVar14 = (float)((ulong)uVar1 >> 0x20) * fVar9;
        auVar15._4_4_ = fVar14;
        auVar15._0_4_ = fVar13;
        auVar15._8_4_ = fVar10 * 0.0;
        auVar15._12_4_ = fVar11 * 0.0;
        auVar15 = minps(auVar5,auVar15);
        *(uint *)(pcVar2 + lVar7) =
             (int)(float)(-(uint)(0.0 <= fVar14) & auVar15._4_4_) << 8 |
             (int)(float)(-(uint)(0.0 <= fVar13) & auVar15._0_4_) << 0x10 |
             (int)(float)(~-(uint)(fVar12 < 0.0) & (uint)fVar4) | 0xff000000;
        lVar7 = lVar7 + 4;
      } while (lVar6 * 4 != lVar7);
    }
    return;
  }
  nullcThrowError("ERROR: Canvas object is nullptr");
  return;
}

Assistant:

void CanvasCommit(Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		int *pStart = (int*)ptr->dataI.ptr, *pEnd = (int*)ptr->dataI.ptr + ptr->width * ptr->height;
		float *fStart = (float*)ptr->data.ptr;
		for(int *pix = pStart; pix != pEnd; pix++)
		{
			int red = int(saturate(*fStart++ * 255.0f));
			int green = int(saturate(*fStart++ * 255.0f));
			int blue = int(saturate(*fStart++ * 255.0f));
			fStart++;

			*pix = (red << 16) | (green << 8) | (blue) | (255 << 24);
		}
	}